

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O0

int ffgpxv(fitsfile *fptr,int datatype,long *firstpix,LONGLONG nelem,void *nulval,void *array,
          int *anynul,int *status)

{
  long in_RCX;
  long in_RDX;
  int *in_stack_00000010;
  int ii;
  int naxis;
  LONGLONG tfirstpix [99];
  int *in_stack_fffffffffffffc88;
  int *in_stack_fffffffffffffc90;
  fitsfile *in_stack_fffffffffffffc98;
  int local_360;
  int local_35c;
  undefined8 local_358 [36];
  void *in_stack_fffffffffffffdc8;
  void *in_stack_fffffffffffffdd0;
  LONGLONG in_stack_fffffffffffffdd8;
  LONGLONG *in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffdec;
  fitsfile *in_stack_fffffffffffffdf0;
  int *in_stack_fffffffffffffe20;
  int *in_stack_fffffffffffffe28;
  int local_4;
  
  if ((*in_stack_00000010 < 1) && (in_RCX != 0)) {
    ffgidm(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    for (local_360 = 0; local_360 < local_35c; local_360 = local_360 + 1) {
      local_358[local_360] = *(undefined8 *)(in_RDX + (long)local_360 * 8);
    }
    ffgpxvll(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde0,
             in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
             in_stack_fffffffffffffe20,in_stack_fffffffffffffe28);
    local_4 = *in_stack_00000010;
  }
  else {
    local_4 = *in_stack_00000010;
  }
  return local_4;
}

Assistant:

int ffgpxv( fitsfile *fptr,   /* I - FITS file pointer                       */
            int  datatype,    /* I - datatype of the value                   */
            long *firstpix,   /* I - coord of first pixel to read (1s based) */
            LONGLONG nelem,   /* I - number of values to read                */
            void *nulval,     /* I - value for undefined pixels              */
            void *array,      /* O - array of values that are returned       */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from the primary array. The datatype of the
  input array is defined by the 2nd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Undefined elements will be set equal to NULVAL, unless NULVAL=0
  in which case no checking for undefined values will be performed.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{
    LONGLONG tfirstpix[99];
    int naxis, ii;

    if (*status > 0 || nelem == 0)   /* inherit input status value if > 0 */
        return(*status);

    /* get the size of the image */
    ffgidm(fptr, &naxis, status);
    
    for (ii=0; ii < naxis; ii++)
       tfirstpix[ii] = firstpix[ii];

    ffgpxvll(fptr, datatype, tfirstpix, nelem, nulval, array, anynul, status);

    return(*status);
}